

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 __thiscall VGMPlayer::LoadTags(VGMPlayer *this)

{
  UINT16 UVar1;
  UINT32 UVar2;
  char *pcVar3;
  bool bVar4;
  string local_78;
  uint local_54;
  char **ppcStack_50;
  UINT32 startPos;
  char **tagListEnd;
  UINT32 eotPos;
  UINT32 curPos;
  ulong local_20;
  size_t curTag;
  VGMPlayer *this_local;
  
  curTag = (size_t)this;
  for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
    std::__cxx11::string::string((string *)&eotPos);
    std::__cxx11::string::operator=
              ((string *)(&this->field_0x2f8 + local_20 * 0x20),(string *)&eotPos);
    std::__cxx11::string::~string((string *)&eotPos);
  }
  this->_tagList[0] = (char *)0x0;
  if ((this->_fileHdr).gd3Ofs == 0) {
    this_local._7_1_ = '\0';
  }
  else if ((this->_fileHdr).gd3Ofs < (this->_fileHdr).eofOfs) {
    if ((this->_fileHdr).eofOfs < (this->_fileHdr).gd3Ofs + 0xc) {
      this_local._7_1_ = 0xf3;
    }
    else if (*(int *)(this->_fileData + (this->_fileHdr).gd3Ofs) == 0x20336447) {
      UVar2 = ReadLE32(this->_fileData + ((this->_fileHdr).gd3Ofs + 4));
      this->_tagVer = UVar2;
      if ((this->_tagVer < 0x100) || (0x1ff < this->_tagVer)) {
        this_local._7_1_ = 0xf1;
      }
      else {
        UVar2 = ReadLE32(this->_fileData + ((this->_fileHdr).gd3Ofs + 8));
        tagListEnd._4_4_ = (this->_fileHdr).gd3Ofs + 0xc;
        tagListEnd._0_4_ = tagListEnd._4_4_ + UVar2;
        if ((this->_fileHdr).eofOfs < (uint)tagListEnd) {
          tagListEnd._0_4_ = (this->_fileHdr).eofOfs;
        }
        local_20 = 0;
        ppcStack_50 = this->_tagList;
        while ((local_20 < 0xb && (local_54 = tagListEnd._4_4_, tagListEnd._4_4_ < (uint)tagListEnd)
               )) {
          while( true ) {
            bVar4 = false;
            if (tagListEnd._4_4_ < (uint)tagListEnd) {
              UVar1 = ReadLE16(this->_fileData + tagListEnd._4_4_);
              bVar4 = UVar1 != 0;
            }
            if (!bVar4) break;
            tagListEnd._4_4_ = tagListEnd._4_4_ + 2;
          }
          GetUTF8String_abi_cxx11_
                    (&local_78,this,this->_fileData + local_54,this->_fileData + tagListEnd._4_4_);
          std::__cxx11::string::operator=
                    ((string *)(&this->field_0x2f8 + local_20 * 0x20),(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          tagListEnd._4_4_ = tagListEnd._4_4_ + 2;
          *ppcStack_50 = _TAG_TYPE_LIST[local_20];
          ppcStack_50 = ppcStack_50 + 1;
          pcVar3 = (char *)std::__cxx11::string::c_str();
          *ppcStack_50 = pcVar3;
          local_20 = local_20 + 1;
          ppcStack_50 = ppcStack_50 + 1;
        }
        *ppcStack_50 = (char *)0x0;
        this_local._7_1_ = '\0';
      }
    }
    else {
      this_local._7_1_ = 0xf0;
    }
  }
  else {
    this_local._7_1_ = 0xf3;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 VGMPlayer::LoadTags(void)
{
	size_t curTag;
	
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
		_tagData[curTag] = std::string();
	_tagList[0] = NULL;
	if (! _fileHdr.gd3Ofs)
		return 0x00;	// no GD3 tag present
	if (_fileHdr.gd3Ofs >= _fileHdr.eofOfs)
		return 0xF3;	// tag error (offset out-of-range)
	
	UINT32 curPos;
	UINT32 eotPos;
	
	if (_fileHdr.gd3Ofs + 0x0C > _fileHdr.eofOfs)	// separate check to catch overflows
		return 0xF3;	// tag error (GD3 header incomplete)
	if (memcmp(&_fileData[_fileHdr.gd3Ofs + 0x00], "Gd3 ", 4))
		return 0xF0;	// bad tag
	
	_tagVer = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x04]);
	if (_tagVer < 0x100 || _tagVer >= 0x200)
		return 0xF1;	// unsupported tag version
	
	eotPos = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x08]);
	curPos = _fileHdr.gd3Ofs + 0x0C;
	eotPos += curPos;
	if (eotPos > _fileHdr.eofOfs)
		eotPos = _fileHdr.eofOfs;
	
	const char **tagListEnd = _tagList;
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
	{
		UINT32 startPos = curPos;
		if (curPos >= eotPos)
			break;
		
		// search for UTF-16 L'\0' character
		while(curPos < eotPos && ReadLE16(&_fileData[curPos]) != L'\0')
			curPos += 0x02;
		_tagData[curTag] = GetUTF8String(&_fileData[startPos], &_fileData[curPos]);
		curPos += 0x02;	// skip '\0'
		
		*(tagListEnd++) = _TAG_TYPE_LIST[curTag];
		*(tagListEnd++) = _tagData[curTag].c_str();
	}
	
	*tagListEnd = NULL;
	
	return 0x00;
}